

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

bool __thiscall mapbox::detail::Earcut<unsigned_int>::isEar(Earcut<unsigned_int> *this,Node *ear)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pNVar1 = ear->prev;
  pNVar2 = ear->next;
  dVar4 = ear->x;
  dVar5 = ear->y;
  if (0.0 <= (dVar5 - pNVar1->y) * (pNVar2->x - dVar4) - (pNVar2->y - dVar5) * (dVar4 - pNVar1->x))
  {
    return false;
  }
  pNVar3 = pNVar2->next;
  do {
    if (pNVar3 == pNVar1) {
      return true;
    }
    dVar6 = pNVar3->x;
    dVar7 = pNVar3->y;
    dVar8 = pNVar2->x - dVar6;
    dVar9 = pNVar2->y - dVar7;
    dVar10 = pNVar1->x - dVar6;
    dVar11 = pNVar1->y - dVar7;
    if (dVar10 * dVar9 <= dVar11 * dVar8) {
      if (((dVar11 * (dVar4 - dVar6) <= dVar10 * (dVar5 - dVar7)) &&
          (dVar8 * (dVar5 - dVar7) <= dVar9 * (dVar4 - dVar6))) &&
         (0.0 <= (pNVar3->next->x - dVar6) * (dVar7 - pNVar3->prev->y) -
                 (pNVar3->next->y - dVar7) * (dVar6 - pNVar3->prev->x))) {
        return false;
      }
    }
    pNVar3 = pNVar3->next;
  } while( true );
}

Assistant:

bool Earcut<N>::isEar(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // now make sure we don't have other points inside the potential ear
    Node* p = ear->next->next;

    while (p != ear->prev) {
        if (pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->next;
    }

    return true;
}